

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration __thiscall
absl::anon_unknown_0::ScaleDouble<std::multiplies>(anon_unknown_0 *this,Duration d,double r)

{
  double dVar1;
  bool bVar2;
  uint32_t uVar3;
  int64_t iVar4;
  undefined8 extraout_RDX;
  Duration DVar5;
  Duration DVar6;
  Duration d_00;
  Duration d_01;
  Duration d_02;
  int64_t local_b8;
  int64_t hi64;
  Duration ans;
  int64_t lo64;
  double lo_frac;
  double lo_int;
  double hi_frac;
  double hi_int;
  undefined8 uStack_70;
  double local_68;
  double local_60;
  double lo_doub;
  uint uStack_50;
  double local_48;
  double local_40;
  double hi_doub;
  double dStack_30;
  multiplies<double> op;
  double r_local;
  Duration d_local;
  uint32_t local_10;
  
  d_00.rep_lo_ = (uint)d.rep_hi_;
  d_00.rep_hi_ = (int64_t)this;
  d_00._12_4_ = 0;
  lo_doub = (double)this;
  uStack_50 = d_00.rep_lo_;
  dStack_30 = r;
  iVar4 = time_internal::GetRepHi(d_00);
  local_48 = (double)iVar4;
  local_40 = std::multiplies<double>::operator()
                       ((multiplies<double> *)((long)&hi_doub + 7),&local_48,
                        &stack0xffffffffffffffd0);
  uStack_70 = CONCAT44(d_local.rep_hi_._4_4_,d_00.rep_lo_);
  DVar5._8_8_ = extraout_RDX;
  DVar5.rep_hi_ = (ulong)d_00.rep_lo_;
  hi_int = (double)this;
  uVar3 = time_internal::GetRepLo((time_internal *)this,DVar5);
  local_68 = (double)uVar3;
  local_60 = std::multiplies<double>::operator()
                       ((multiplies<double> *)((long)&hi_doub + 7),&local_68,
                        &stack0xffffffffffffffd0);
  hi_frac = 0.0;
  lo_int = modf(local_40,&hi_frac);
  local_60 = lo_int + local_60 / 4000000000.0;
  lo_frac = 0.0;
  dVar1 = modf(local_60,&lo_frac);
  dVar1 = Round<double>(dVar1 * 4000000000.0);
  ans._8_8_ = (BADTYPE)dVar1;
  Duration::Duration((Duration *)&hi64);
  bVar2 = SafeAddRepHi(hi_frac,lo_frac,(Duration *)&hi64);
  local_10 = (uint32_t)ans.rep_hi_;
  if (bVar2) {
    d_01.rep_lo_ = (uint32_t)ans.rep_hi_;
    d_01.rep_hi_ = hi64;
    d_01._12_4_ = 0;
    local_b8 = time_internal::GetRepHi(d_01);
    bVar2 = SafeAddRepHi((double)local_b8,(double)((long)ans._8_8_ / 4000000000),(Duration *)&hi64);
    local_10 = (uint32_t)ans.rep_hi_;
    if (bVar2) {
      d_02.rep_lo_ = (uint32_t)ans.rep_hi_;
      d_02.rep_hi_ = hi64;
      d_02._12_4_ = 0;
      local_b8 = time_internal::GetRepHi(d_02);
      ans._8_8_ = (long)ans._8_8_ % 4000000000;
      NormalizeTicks(&local_b8,(int64_t *)&ans.rep_lo_);
      DVar5 = time_internal::MakeDuration(local_b8,ans._8_8_);
      d_local._8_8_ = DVar5.rep_hi_;
      local_10 = DVar5.rep_lo_;
    }
    else {
      d_local._8_8_ = hi64;
    }
  }
  else {
    d_local._8_8_ = hi64;
  }
  DVar6.rep_lo_ = local_10;
  DVar6.rep_hi_ = d_local._8_8_;
  DVar6._12_4_ = 0;
  return DVar6;
}

Assistant:

inline Duration ScaleDouble(Duration d, double r) {
  Operation<double> op;
  double hi_doub = op(time_internal::GetRepHi(d), r);
  double lo_doub = op(time_internal::GetRepLo(d), r);

  double hi_int = 0;
  double hi_frac = std::modf(hi_doub, &hi_int);

  // Moves hi's fractional bits to lo.
  lo_doub /= kTicksPerSecond;
  lo_doub += hi_frac;

  double lo_int = 0;
  double lo_frac = std::modf(lo_doub, &lo_int);

  // Rolls lo into hi if necessary.
  int64_t lo64 = Round(lo_frac * kTicksPerSecond);

  Duration ans;
  if (!SafeAddRepHi(hi_int, lo_int, &ans)) return ans;
  int64_t hi64 = time_internal::GetRepHi(ans);
  if (!SafeAddRepHi(hi64, lo64 / kTicksPerSecond, &ans)) return ans;
  hi64 = time_internal::GetRepHi(ans);
  lo64 %= kTicksPerSecond;
  NormalizeTicks(&hi64, &lo64);
  return time_internal::MakeDuration(hi64, lo64);
}